

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O0

GF2E __thiscall field::GF2E::inverse(GF2E *this)

{
  uint64_t data;
  bool in_stack_000002ef;
  uint64_t in_stack_000002f0;
  uint64_t in_stack_000002f8;
  GF2E local_8;
  
  data = anon_unknown.dwarf_49b37::mod_inverse
                   (in_stack_000002f8,in_stack_000002f0,in_stack_000002ef);
  GF2E(&local_8,data);
  return (GF2E)local_8.data;
}

Assistant:

GF2E GF2E::inverse() const { return GF2E(mod_inverse(this->data, modulus, msb)); }